

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::operator=(path *this,path *path)

{
  path_type *in_RSI;
  path *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000088;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  
  in_RDI->m_type = *in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_00000090,in_stack_00000088);
  in_RDI->m_absolute = (bool)((char)in_RSI[8] & native_path);
  in_RDI->m_smb = (bool)(*(byte *)((long)in_RSI + 0x21) & 1);
  return in_RDI;
}

Assistant:

path &operator=(const path &path) {
        m_type = path.m_type;
        m_path = path.m_path;
        m_absolute = path.m_absolute;
        m_smb = path.m_smb;
        return *this;
    }